

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void FFTProcess<float>(UnityComplexNumber *data,int numsamples,bool forward)

{
  UnityComplexNumber UVar1;
  bool bVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  UnityComplexNumber *pUVar8;
  uint uVar9;
  UnityComplexNumber *pUVar10;
  uint uVar11;
  uint uVar12;
  float __x;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar19;
  float fVar20;
  UnityComplexNumber UVar18;
  float fVar21;
  
  uVar6 = (ulong)(uint)numsamples;
  uVar5 = 0;
  if (1 < (uint)numsamples) {
    uVar7 = 1;
    do {
      uVar7 = uVar7 * 2;
      uVar12 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar12;
    } while (uVar7 < (uint)numsamples);
    uVar5 = (ulong)uVar12;
  }
  puVar3 = FFTProcess<float>::reversetable[uVar5];
  if (puVar3 == (uint *)0x0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < numsamples) {
      uVar4 = uVar6 * 4;
    }
    puVar3 = (uint *)operator_new__(uVar4);
    if (numsamples != 0) {
      uVar4 = 0;
      do {
        uVar7 = 0;
        if (numsamples != 1) {
          uVar12 = 1;
          uVar7 = 0;
          uVar9 = numsamples >> 1;
          do {
            uVar11 = uVar9 & (uint)uVar4;
            if (uVar11 != 0) {
              uVar11 = uVar12;
            }
            uVar7 = uVar7 | uVar11;
            uVar12 = uVar12 * 2;
            bVar2 = 1 < uVar9;
            uVar9 = uVar9 >> 1;
          } while (bVar2);
        }
        puVar3[uVar4] = uVar7;
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar6);
    }
    FFTProcess<float>::reversetable[uVar5] = puVar3;
  }
  if (numsamples != 0) {
    uVar5 = 0;
    do {
      uVar4 = (ulong)puVar3[uVar5];
      if (uVar5 < uVar4) {
        UVar1 = data[uVar5];
        data[uVar5] = data[uVar4];
        data[uVar4] = UVar1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
    if (1 < numsamples) {
      if (forward) {
        __x = -3.1415927;
      }
      else {
        __x = 3.1415927;
      }
      uVar7 = 1;
      do {
        fVar13 = cosf(__x);
        fVar14 = sinf(__x);
        uVar12 = uVar7 * 2;
        if (0 < (int)uVar7) {
          uVar6 = (ulong)uVar7;
          uVar5 = 0;
          fVar15 = 1.0;
          fVar16 = 0.0;
          pUVar8 = data;
          do {
            if ((int)uVar5 < numsamples) {
              uVar4 = uVar5 & 0xffffffff;
              pUVar10 = pUVar8;
              do {
                fVar20 = pUVar10[uVar6].re;
                fVar19 = pUVar10[uVar6].im;
                fVar17 = fVar20 * fVar15 + fVar19 * -fVar16;
                fVar20 = fVar19 * fVar15 + fVar20 * fVar16;
                fVar19 = (*pUVar10).re;
                fVar21 = (*pUVar10).im;
                UVar1.im = fVar21 - fVar20;
                UVar1.re = fVar19 - fVar17;
                pUVar10[uVar6] = UVar1;
                UVar18.re = fVar17 + fVar19;
                UVar18.im = fVar20 + fVar21;
                *pUVar10 = UVar18;
                pUVar10 = pUVar10 + uVar12;
                uVar7 = (int)uVar4 + uVar12;
                uVar4 = (ulong)uVar7;
              } while ((int)uVar7 < numsamples);
            }
            fVar20 = fVar15 * fVar14;
            fVar15 = -fVar16 * fVar14 + fVar15 * fVar13;
            fVar16 = fVar16 * fVar13 + fVar20;
            uVar5 = uVar5 + 1;
            pUVar8 = pUVar8 + 1;
          } while (uVar5 != uVar6);
        }
        __x = __x * 0.5;
        uVar7 = uVar12;
      } while ((int)uVar12 < numsamples);
    }
  }
  return;
}

Assistant:

static void FFTProcess(UnityComplexNumber* data, int numsamples, bool forward)
{
    unsigned int count = 1, numbits = 0;
    while (count < numsamples)
    {
        count += count;
        ++numbits;
    }

    static unsigned int* reversetable[32] = { NULL };
    unsigned int* tbl = reversetable[numbits];
    if (tbl == NULL)
    {
        tbl = new unsigned int[numsamples];
        for (unsigned int n = 0; n < numsamples; n++)
        {
            unsigned int j = 1, k = 0, m = numsamples >> 1;
            while (m > 0)
            {
                if (n & m)
                    k |= j;
                j += j;
                m >>= 1;
            }
            tbl[n] = k;
        }
#if ENABLE_TESTS
        for (unsigned int n = 0; n < numsamples; n++)
        {
            assert(tbl[tbl[n]] == n);
        }
#endif
        reversetable[numbits] = tbl;
    }

    for (unsigned int i = 0; i < numsamples; i++)
    {
        unsigned int j = tbl[i];
        if (i < j)
        {
            UnitySwap(data[i].re, data[j].re);
            UnitySwap(data[i].im, data[j].im);
        }
    }

    T w0 = (forward) ? -T(kPI_double) : T(kPI_double);
    for (int j = 1; j < numsamples; j += j)
    {
        UnityComplexNumberT<T> wr, wd;
        wr.Set(T(cos(w0)), T(sin(w0)));
        wd.Set(T(1.0), T(0.0));
        int step = j + j;
        for (int m = 0; m < j; ++m)
        {
            for (int i = m; i < numsamples; i += step)
            {
                UnityComplexNumberT<T> t;
                UnityComplexNumber::Mul(wd, data[i + j], t);
                UnityComplexNumber::Sub(data[i], t, data[i + j]);
                UnityComplexNumber::Add(data[i], t, data[i]);
            }
            UnityComplexNumber::Mul(wd, wr, wd);
        }
        w0 *= T(0.5);
    }
}